

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recog_centaur.c
# Opt level: O0

intel_model_t get_model_code(cpu_id_t *data)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *s;
  ushort **ppuVar5;
  bool bVar6;
  int local_34;
  int local_30;
  int ndigs;
  int model_no;
  int mod_flags;
  char *bs;
  int l;
  int i;
  cpu_id_t *data_local;
  
  sVar4 = strlen(data->brand_str);
  iVar3 = (int)sVar4;
  s = data->brand_str;
  ndigs = 0;
  local_30 = 0;
  local_34 = 0;
  iVar1 = match_pattern(s,"Core(TM) i[3579]");
  if (iVar1 == 0) {
    iVar1 = match_pattern(s,"Core(TM) [3579]");
    if (iVar1 == 0) {
      iVar1 = match_pattern(s,"Core(TM) Ultra [3579]");
      if (iVar1 == 0) {
        iVar1 = match_pattern(s,"Xeon(R) [WBSGP]");
        if (iVar1 == 0) {
          bs._4_4_ = 0;
          while ((bs._4_4_ < iVar3 + -3 &&
                 (((s[bs._4_4_] != 'C' || (s[bs._4_4_ + 1] != 'P')) || (s[bs._4_4_ + 2] != 'U')))))
          {
            bs._4_4_ = bs._4_4_ + 1;
          }
          if (bs._4_4_ < iVar3 + -3) {
            bs._4_4_ = bs._4_4_ + 3;
            while( true ) {
              bVar6 = false;
              if (bs._4_4_ < iVar3 + -4) {
                bVar6 = s[bs._4_4_] == ' ';
              }
              if (!bVar6) break;
              bs._4_4_ = bs._4_4_ + 1;
            }
            if (bs._4_4_ < iVar3 + -4) {
              while( true ) {
                bVar6 = false;
                if (bs._4_4_ < iVar3 + -4) {
                  ppuVar5 = __ctype_b_loc();
                  bVar6 = ((*ppuVar5)[(int)s[bs._4_4_]] & 0x800) == 0;
                }
                if (!bVar6) break;
                if (('@' < s[bs._4_4_]) && (s[bs._4_4_] < '[')) {
                  ndigs = 1 << (s[bs._4_4_] + 0xbfU & 0x1f) | ndigs;
                }
                bs._4_4_ = bs._4_4_ + 1;
              }
              if (bs._4_4_ < iVar3 + -4) {
                while (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)s[bs._4_4_]] & 0x800) != 0) {
                  local_34 = local_34 + 1;
                  local_30 = local_30 * 10 + s[bs._4_4_] + -0x30;
                  bs._4_4_ = bs._4_4_ + 1;
                }
                if (local_34 == 4) {
                  switch(local_30 / 100) {
                  case 0x1e:
                    data_local._4_4_ = _3000;
                    break;
                  case 0x1f:
                    data_local._4_4_ = _3100;
                    break;
                  case 0x20:
                    data_local._4_4_ = _3200;
                    if ((ndigs & 0x800000U) != 0) {
                      data_local._4_4_ = X3200;
                    }
                    break;
                  case 0x21:
                    data_local._4_4_ = _3300;
                    if ((ndigs & 0x800000U) != 0) {
                      data_local._4_4_ = X3300;
                    }
                    break;
                  default:
                    data_local._4_4_ = UNKNOWN;
                    break;
                  case 0x33:
                    data_local._4_4_ = _5100;
                    break;
                  case 0x34:
                    data_local._4_4_ = _5200;
                    break;
                  case 0x35:
                    data_local._4_4_ = _5300;
                    break;
                  case 0x36:
                    data_local._4_4_ = _5400;
                  }
                }
                else {
                  data_local._4_4_ = UNKNOWN;
                }
              }
              else {
                data_local._4_4_ = UNKNOWN;
              }
            }
            else {
              data_local._4_4_ = UNKNOWN;
            }
          }
          else {
            data_local._4_4_ = UNKNOWN;
          }
        }
        else {
          iVar3 = match_pattern(s,"Xeon(R) W-");
          if (iVar3 == 0) {
            iVar3 = match_pattern(s,"Xeon(R) Bronze");
            if (iVar3 == 0) {
              iVar3 = match_pattern(s,"Xeon(R) Silver");
              if (iVar3 == 0) {
                iVar3 = match_pattern(s,"Xeon(R) Gold");
                if (iVar3 == 0) {
                  iVar3 = match_pattern(s,"Xeon(R) Platinum");
                  if (iVar3 == 0) {
                    bs._4_4_ = match_pattern(s,"Xeon(R) Max");
                    if (bs._4_4_ != 0) {
                      bs._4_4_ = bs._4_4_ + 0xc;
                    }
                  }
                  else {
                    bs._4_4_ = iVar3 + 0x11;
                  }
                }
                else {
                  bs._4_4_ = iVar3 + 0xd;
                }
              }
              else {
                bs._4_4_ = iVar3 + 0xf;
              }
            }
            else {
              bs._4_4_ = iVar3 + 0xf;
            }
          }
          else {
            bs._4_4_ = iVar3 + 10;
          }
          if (bs._4_4_ == 0) {
            data_local._4_4_ = UNKNOWN;
          }
          else if (s[bs._4_4_] == '1') {
            data_local._4_4_ = _x1xx;
          }
          else if (s[bs._4_4_] == '2') {
            data_local._4_4_ = _x2xx;
          }
          else if (s[bs._4_4_] == '3') {
            data_local._4_4_ = _x3xx;
          }
          else if (s[bs._4_4_] == '4') {
            data_local._4_4_ = _x4xx;
          }
          else if (s[bs._4_4_] == '5') {
            data_local._4_4_ = _x5xx;
          }
          else {
            data_local._4_4_ = UNKNOWN;
          }
        }
      }
      else if (iVar1 + 0x12 < iVar3) {
        if (s[iVar1 + 0x10] == '1') {
          data_local._4_4_ = _1xx;
        }
        else if (s[iVar1 + 0x10] == '2') {
          data_local._4_4_ = _2xx;
        }
        else {
          data_local._4_4_ = UNKNOWN;
        }
      }
      else {
        data_local._4_4_ = UNKNOWN;
      }
    }
    else {
      iVar2 = iVar1 + 0xb;
      if (iVar1 + 0xd < iVar3) {
        if ((s[iVar2] == '1') && (s[iVar1 + 0xc] == '5')) {
          data_local._4_4_ = _x5x;
        }
        else if ((s[iVar2] == '2') && (s[iVar1 + 0xc] == '5')) {
          data_local._4_4_ = _x5x;
        }
        else if ((s[iVar2] == '3') && (s[iVar1 + 0xc] == '5')) {
          data_local._4_4_ = _x5x;
        }
        else {
          data_local._4_4_ = UNKNOWN;
        }
      }
      else {
        data_local._4_4_ = UNKNOWN;
      }
    }
  }
  else {
    iVar2 = iVar1 + 0xb;
    if (iVar1 + 0xe < iVar3) {
      if (s[iVar2] == '2') {
        data_local._4_4_ = _2xxx;
      }
      else if (s[iVar2] == '3') {
        data_local._4_4_ = _3xxx;
      }
      else if (s[iVar2] == '4') {
        data_local._4_4_ = _4xxx;
      }
      else if (s[iVar2] == '5') {
        data_local._4_4_ = _5xxx;
      }
      else if (s[iVar2] == '6') {
        data_local._4_4_ = _6xxx;
      }
      else if (s[iVar2] == '7') {
        data_local._4_4_ = _7xxx;
      }
      else if (s[iVar2] == '8') {
        data_local._4_4_ = _8xxx;
      }
      else if (s[iVar2] == '9') {
        data_local._4_4_ = _9xxx;
      }
      else if (iVar1 + 0xf < iVar3) {
        if ((s[iVar2] == '1') && (s[iVar1 + 0xc] == '0')) {
          data_local._4_4_ = _10xxx;
        }
        else if ((s[iVar2] == '1') && (s[iVar1 + 0xc] == '1')) {
          data_local._4_4_ = _11xxx;
        }
        else if ((s[iVar2] == '1') && (s[iVar1 + 0xc] == '2')) {
          data_local._4_4_ = _12xxx;
        }
        else if ((s[iVar2] == '1') && (s[iVar1 + 0xc] == '3')) {
          data_local._4_4_ = _13xxx;
        }
        else if ((s[iVar2] == '1') && (s[iVar1 + 0xc] == '4')) {
          data_local._4_4_ = _14xxx;
        }
        else {
          data_local._4_4_ = UNKNOWN;
        }
      }
      else {
        data_local._4_4_ = UNKNOWN;
      }
    }
    else {
      data_local._4_4_ = UNKNOWN;
    }
  }
  return data_local._4_4_;
}

Assistant:

static centaur_model_t get_model_code(struct cpu_id_t* data, centaur_code_and_bits_t brand)
{
	int i = 0;
	int l = (int) strlen(data->brand_str);
	const char *bs = data->brand_str;

	if (brand.code == ZHAOXIN) {
		if ((i = match_pattern(bs, "KaiSheng KH-")) != 0) {
			i += 11;
			if (i + 4 >= l) return UNKNOWN;
			switch(bs[i]) {
				case '2': return _20000;
				case '3': return _30000;
				case '4': return _40000;
				default: return UNKNOWN;
			}
		}
		else if ((i = match_pattern(bs, "KaiXian KX-")) != 0) {
			i += 10;
			if (bs[i] == 'U') i++;
			if (i + 3 >= l) return UNKNOWN;
			switch(bs[i]) {
				case '4': return _4000;
				case '5': return _5000;
				case '6': return _6000;
				case '7': return _7000;
				default: return UNKNOWN;
			}
		}
	}

	return UNKNOWN;
}